

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Scalar::setParameter(Scalar *this,string *name,string *value)

{
  bool bVar1;
  stringstream local_1a8 [8];
  stringstream parameter;
  ostream local_198;
  string *local_20;
  string *value_local;
  string *name_local;
  Scalar *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"value");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(&local_198,(string *)local_20);
    std::istream::operator>>((istream *)local_1a8,&this->scalarValue);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    Parametric::setParameter((Parametric *)this,value_local,local_20);
  }
  return;
}

Assistant:

void Scalar::setParameter(const string& name, const string& value)
{
	if (name=="value") {
		stringstream parameter;
		parameter << value;
		parameter >> scalarValue;
	} else
		StochasticFunction::setParameter(name, value);
}